

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_aggsig_verify
              (secp256k1_context *ctx,secp256k1_scratch_space *scratch,uchar *sig64,uchar *msg32,
              secp256k1_pubkey *pubkeys,size_t n_pubkeys)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int overflow;
  secp256k1_fe r_x;
  secp256k1_scalar g_sc;
  secp256k1_verify_callback_data cbdata;
  secp256k1_gej pk_sum;
  secp256k1_ge pk_sum_ge;
  int local_1a4;
  secp256k1_fe local_1a0;
  secp256k1_scalar local_178;
  secp256k1_context *local_158;
  uchar local_150 [64];
  secp256k1_pubkey *local_110;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)",(ctx->illegal_callback).data);
    iVar3 = 0;
  }
  else {
    iVar2 = 0;
    iVar3 = 0;
    if (n_pubkeys != 0) {
      iVar1 = secp256k1_fe_set_b32(&local_1a0,sig64);
      iVar3 = iVar2;
      if (iVar1 != 0) {
        secp256k1_scalar_set_b32(&local_178,sig64 + 0x20,&local_1a4);
        if (local_1a4 == 0) {
          local_158 = ctx;
          local_110 = pubkeys;
          secp256k1_compute_prehash(ctx,local_150,pubkeys,n_pubkeys,&local_1a0,msg32);
          iVar2 = secp256k1_ecmult_multi_var
                            (&ctx->ecmult_ctx,scratch,&local_108,&local_178,
                             secp256k1_aggsig_verify_callback,&local_158,n_pubkeys);
          if (iVar2 != 0) {
            secp256k1_ge_set_gej(&local_88,&local_108);
            iVar2 = secp256k1_fe_equal_var(&local_1a0,&local_88.x);
            if (iVar2 != 0) {
              iVar3 = secp256k1_gej_has_quad_y_var(&local_108);
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int secp256k1_aggsig_verify(const secp256k1_context* ctx, secp256k1_scratch_space *scratch, const unsigned char *sig64, const unsigned char *msg32, const secp256k1_pubkey *pubkeys, size_t n_pubkeys) {
    secp256k1_scalar g_sc;
    secp256k1_gej pk_sum;
    secp256k1_ge pk_sum_ge;
    secp256k1_fe r_x;
    int overflow;
    secp256k1_verify_callback_data cbdata;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(scratch != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(pubkeys != NULL);
    (void) ctx;

    if (n_pubkeys == 0) {
        return 0;
    }

    /* extract R */
    if (!secp256k1_fe_set_b32(&r_x, sig64)) {
        return 0;
    }

    /* extract s */
    secp256k1_scalar_set_b32(&g_sc, sig64 + 32, &overflow);
    if (overflow) {
        return 0;
    }

    /* Populate callback data */
    cbdata.ctx = ctx;
    cbdata.pubkeys = pubkeys;
    secp256k1_compute_prehash(ctx, cbdata.prehash, pubkeys, n_pubkeys, &r_x, msg32);

    /* Compute sum sG - e_i*P_i, which should be R */
    if (!secp256k1_ecmult_multi_var(&ctx->ecmult_ctx, scratch, &pk_sum, &g_sc, secp256k1_aggsig_verify_callback, &cbdata, n_pubkeys)) {
        return 0;
    }

    /* Check sum */
    secp256k1_ge_set_gej(&pk_sum_ge, &pk_sum);
    return secp256k1_fe_equal_var(&r_x, &pk_sum_ge.x) &&
           secp256k1_gej_has_quad_y_var(&pk_sum);
}